

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_is_equal(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *psVar2;
  uint64_t in_RDX;
  uint64_t lab_00;
  uint64_t lab_01;
  compiler_options *pcVar3;
  string lab_eq;
  string lab;
  string error;
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = label;
  pcVar3 = (compiler_options *)local_88;
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_((string *)(local_88 + 8),psVar2,in_RDX);
    std::__cxx11::string::operator=((string *)&local_40,(string *)(local_88 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._12_4_,local_88._8_4_) != &local_70) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_88._12_4_,local_88._8_4_),local_70._M_allocated_capacity + 1
                     );
    }
    local_88[8] = true;
    local_88[9] = false;
    local_88[10] = false;
    local_88[0xb] = false;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_88._0_4_ = NUMBER;
    local_88[4] = true;
    local_88[5] = false;
    local_88[6] = false;
    local_88[7] = false;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)(local_88 + 8),(operand *)&local_60,(operand *)local_88,
               (int *)(local_88 + 4));
    local_88[8] = true;
    local_88[9] = false;
    local_88[10] = false;
    local_88[0xb] = false;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)(local_88 + 8),&local_40);
  }
  local_88[8] = true;
  local_88[9] = false;
  local_88[10] = false;
  local_88[0xb] = false;
  local_60._M_dataplus._M_p._0_4_ = 9;
  local_88._0_4_ = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)(local_88 + 8),(operand *)&local_60,(operand *)local_88);
  local_88[8] = true;
  local_88[9] = false;
  local_88[10] = false;
  local_88[0xb] = false;
  local_60._M_dataplus._M_p._0_4_ = 0x14;
  local_88._0_4_ = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)(local_88 + 8),(operand *)&local_60,(operand *)local_88);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)(local_88 + 8),psVar2,lab_00);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar2,lab_01);
  local_88._0_4_ = BYTE_MEM_RDX;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)local_88,&local_60);
  compile_recursively_equal(code,pcVar3,(string *)(local_88 + 8));
  local_88._0_4_ = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)local_88,&local_60);
  local_88._0_4_ = BL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 8));
  local_88._0_4_ = BYTE_MEM_RDX;
  local_88[4] = true;
  local_88[5] = false;
  local_88[6] = false;
  local_88[7] = false;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)local_88,(operand *)(local_88 + 4));
  if (ops->safe_primitives == true) {
    error_label(code,&local_40,re_isequal_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_88._12_4_,local_88._8_4_) != &local_70) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_88._12_4_,local_88._8_4_),local_70._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_is_equal(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNE, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::RDX);
  std::string lab_eq = label_to_string(label++);
  std::string lab = label_to_string(label++);
  code.add(asmcode::JMP, lab);
  compile_recursively_equal(code, ops, lab_eq);
  code.add(asmcode::LABEL, lab);
  code.add(asmcode::CALL, lab_eq);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_isequal_contract_violation);
    }
  }